

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O0

void sort_actions(void)

{
  bool bVar1;
  int iVar2;
  int w;
  int t;
  int k;
  int j;
  int i;
  
  order = (Yshort *)allocate(nvectors << 2);
  nentries = 0;
  for (k = 0; k < nvectors; k = k + 1) {
    if (0 < tally[k]) {
      t = nentries;
      do {
        t = t + -1;
        bVar1 = false;
        if (-1 < t) {
          bVar1 = width[order[t]] < width[k];
        }
      } while (bVar1);
      while( true ) {
        bVar1 = false;
        if ((-1 < t) && (bVar1 = false, width[order[t]] == width[k])) {
          bVar1 = tally[order[t]] < tally[k];
        }
        iVar2 = nentries;
        if (!bVar1) break;
        t = t + -1;
      }
      while (w = iVar2 + -1, t < w) {
        order[iVar2] = order[w];
        iVar2 = w;
      }
      order[t + 1] = k;
      nentries = nentries + 1;
    }
  }
  return;
}

Assistant:

void sort_actions()
{
  register int i;
  register int j;
  register int k;
  register int t;
  register int w;

  order = NEW2(nvectors, Yshort);
  nentries = 0;

  for (i = 0; i < nvectors; i++)
    {
      if (tally[i] > 0)
	{
	  t = tally[i];
	  w = width[i];
	  j = nentries - 1;

	  while (j >= 0 && (width[order[j]] < w))
	    j--;

	  while (j >= 0 && (width[order[j]] == w) && (tally[order[j]] < t))
	    j--;

	  for (k = nentries - 1; k > j; k--)
	    order[k + 1] = order[k];

	  order[j + 1] = i;
	  nentries++;
	}
    }
}